

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O1

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<bool,float>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          float *out_value)

{
  bool bVar1;
  uchar uVar2;
  pointer puVar3;
  byte bVar4;
  pointer puVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  uVar7 = *(uint *)&this->num_components_;
  bVar4 = out_num_components;
  if ((byte)uVar7 < out_num_components) {
    bVar4 = (byte)uVar7;
  }
  bVar8 = bVar4 == 0;
  if (bVar8) {
LAB_001124df:
    if ((byte)uVar7 < out_num_components) {
      memset(out_value + (uVar7 & 0xff),0,
             (ulong)((uint)out_num_components + ~(uVar7 & 0xff)) * 4 + 4);
    }
  }
  else {
    puVar5 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start +
             this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_;
    puVar3 = (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar5 < puVar3) {
      bVar1 = this->normalized_;
      uVar6 = 1;
      do {
        uVar2 = *puVar5;
        if ((bVar1 & 1U) != 0) {
          out_value[uVar6 - 1] = (float)(int)(char)uVar2;
        }
        out_value[uVar6 - 1] = (float)(int)(char)uVar2;
        uVar7 = *(uint *)&this->num_components_;
        bVar4 = (byte)uVar7;
        if (out_num_components <= (byte)uVar7) {
          bVar4 = out_num_components;
        }
        bVar8 = bVar4 <= uVar6;
        if (bVar8) goto LAB_001124df;
        puVar5 = puVar5 + 1;
        uVar6 = uVar6 + 1;
      } while (puVar5 < puVar3);
    }
  }
  return bVar8;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }